

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_7::TileBufferTask::execute(TileBufferTask *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  reference ppTVar8;
  reference pvVar9;
  char **ppcVar10;
  reference pvVar11;
  char *pcVar12;
  int *piVar13;
  char *pcVar14;
  Compressor *pCVar15;
  ulong sampleCountXStride;
  long in_RDI;
  exception *e;
  Int64 compSize;
  char *compPtr;
  int j;
  int count;
  int i_3;
  Int64 tableDataSize;
  char *ptr;
  int yOffsetForData;
  int xOffsetForData;
  TOutSliceInfo *slice_1;
  uint i_2;
  int y;
  int yOffsetForSampleCount;
  int xOffsetForSampleCount;
  char *writePtr;
  size_t i_1;
  Int64 maxBytesPerTileLine;
  Int64 totalBytes;
  TOutSliceInfo *slice;
  size_t i;
  vector<int,_std::allocator<int>_> yOffsets;
  vector<int,_std::allocator<int>_> xOffsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  int numScanLines;
  Box2i tileRange;
  int in_stack_fffffffffffffd4c;
  int iVar16;
  undefined4 in_stack_fffffffffffffd54;
  vector<int,_std::allocator<int>_> *size;
  undefined8 in_stack_fffffffffffffd60;
  allocator_type *__a;
  Array<char> *this_00;
  size_type in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  Array<char> *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  size_t in_stack_fffffffffffffda8;
  long *plVar17;
  size_t in_stack_fffffffffffffdb0;
  undefined8 uVar18;
  int in_stack_fffffffffffffdb8;
  Compression in_stack_fffffffffffffdbc;
  undefined4 uVar19;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  TileDescription *in_stack_fffffffffffffdc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int local_1c8;
  undefined4 in_stack_fffffffffffffe40;
  PixelType in_stack_fffffffffffffe44;
  int iVar20;
  char **writePtr_00;
  ulong uVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *sampleStride;
  ptrdiff_t in_stack_fffffffffffffeb0;
  Format in_stack_fffffffffffffeb8;
  PixelType in_stack_fffffffffffffec0;
  undefined8 local_130;
  int local_124;
  int local_120;
  int local_11c;
  ulong local_118;
  char *local_110;
  int local_108;
  int local_104;
  value_type local_100;
  uint local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  char *local_e8;
  char **local_e0;
  value_type local_d8;
  long local_d0;
  value_type local_c8;
  ulong local_c0;
  undefined1 local_b1;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_91;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  int local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  __a = (allocator_type *)
        CONCAT44((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                 *(undefined4 *)(*(long *)(in_RDI + 0x18) + 100));
  dataWindowForTile(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                    (int)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                    in_stack_fffffffffffffdb8,in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                    in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8);
  local_58 = (local_3c - local_44) + 1;
  uVar4 = (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + 0x44);
  sampleStride = &local_71;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1faa64);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
             ,(allocator_type *)__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1faa90);
  sVar5 = std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                  *)(*(long *)(in_RDI + 0x10) + 0x120));
  puVar23 = &local_91;
  std::allocator<int>::allocator((allocator<int> *)0x1faac5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
             ,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x1faaf1);
  sVar6 = std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                  *)(*(long *)(in_RDI + 0x10) + 0x120));
  puVar22 = &local_b1;
  std::allocator<int>::allocator((allocator<int> *)0x1fab26);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
             ,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x1fab52);
  local_c0 = 0;
  while (uVar21 = local_c0,
        sVar7 = std::
                vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                        *)(*(long *)(in_RDI + 0x10) + 0x120)), uVar21 < sVar7) {
    ppTVar8 = std::
              vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                            *)(*(long *)(in_RDI + 0x10) + 0x120),local_c0);
    local_c8 = *ppTVar8;
    iVar2 = local_c8->xTileCoords * local_48;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,local_c0);
    *pvVar9 = iVar2;
    iVar2 = local_c8->yTileCoords * local_44;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,local_c0);
    *pvVar9 = iVar2;
    local_c0 = local_c0 + 1;
  }
  this_00 = (Array<char> *)&local_b0;
  size = &local_90;
  iVar2 = local_44;
  iVar16 = local_3c;
  calculateBytesPerLine
            ((Header *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88,
             (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdd0);
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = (char **)0x0;
  while (writePtr_00 = local_e0,
        ppcVar10 = (char **)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                      (&local_70), writePtr_00 < ppcVar10) {
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_70,(size_type)local_e0);
    local_d0 = *pvVar11 + local_d0;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_70,(size_type)local_e0);
    if (local_d8 < *pvVar11) {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_70,(size_type)local_e0);
      local_d8 = *pvVar11;
    }
    local_e0 = (char **)((long)local_e0 + 1);
  }
  Array<char>::resizeErase(this_00,(long)size);
  pcVar12 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
  iVar20 = local_48;
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x1b0) == 0) {
    iVar20 = 0;
  }
  iVar3 = local_44;
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x1b4) == 0) {
    iVar3 = 0;
  }
  local_f0 = iVar3;
  local_ec = iVar20;
  local_e8 = pcVar12;
  for (local_f4 = local_44; local_f4 <= local_3c; local_f4 = local_f4 + 1) {
    local_f8 = 0;
    while( true ) {
      sampleCountXStride = (ulong)local_f8;
      sVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                      *)(*(long *)(in_RDI + 0x10) + 0x120));
      if (sVar7 <= sampleCountXStride) break;
      ppTVar8 = std::
                vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                              *)(*(long *)(in_RDI + 0x10) + 0x120),(ulong)local_f8);
      local_100 = *ppTVar8;
      if ((local_100->zero & 1U) == 0) {
        local_104 = local_48;
        if (local_100->xTileCoords == 0) {
          local_104 = 0;
        }
        if (local_100->yTileCoords == 0) {
          local_1c8 = 0;
        }
        else {
          local_1c8 = local_44;
        }
        local_108 = local_1c8;
        in_stack_fffffffffffffd78 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100->sampleStride;
        in_stack_fffffffffffffd80 = local_100->xStride;
        in_stack_fffffffffffffd88 = (Array<char> *)local_100->yStride;
        in_stack_fffffffffffffd90 = *(int *)(*(long *)(in_RDI + 0x10) + 0x118);
        this_00 = (Array<char> *)CONCAT44((int)((ulong)this_00 >> 0x20),local_f0);
        iVar2 = local_48;
        iVar16 = local_40;
        copyFromDeepFrameBuffer
                  (writePtr_00,pcVar12,(char *)CONCAT44(iVar20,iVar3),sampleCountXStride,
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),local_104,
                   (int)uVar21,(int)sVar6,(int)puVar22,(int)sVar5,(int)puVar23,(int)uVar4,
                   (ptrdiff_t)sampleStride,in_RDI,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
      }
      else {
        in_stack_fffffffffffffe40 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x118);
        in_stack_fffffffffffffe44 = local_100->type;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&local_70,(long)(local_f4 - local_44));
        fillChannelWithZeroes
                  ((char **)in_stack_fffffffffffffdd0,
                   (Format)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                   (PixelType)in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
      }
      local_f8 = local_f8 + 1;
    }
  }
  local_110 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x30));
  local_118 = 0;
  for (local_11c = local_44; iVar20 = (int)(in_stack_fffffffffffffd80 >> 0x20),
      local_11c <= local_3c; local_11c = local_11c + 1) {
    local_120 = 0;
    for (local_124 = local_48; local_124 <= local_40; local_124 = local_124 + 1) {
      piVar13 = DeepTiledOutputFile::Data::getSampleCount
                          ((Data *)CONCAT44(in_stack_fffffffffffffd54,iVar16),
                           in_stack_fffffffffffffd4c,iVar2);
      local_120 = local_120 + *piVar13;
      Xdr::write<Imf_2_5::CharPtrIO,char*>
                ((char **)CONCAT44(in_stack_fffffffffffffd54,iVar16),in_stack_fffffffffffffd4c);
      local_118 = local_118 + 4;
    }
  }
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0x50) != 0) {
    plVar17 = *(long **)(*(long *)(in_RDI + 0x18) + 0x50);
    pcVar12 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x30));
    iVar3 = (**(code **)(*plVar17 + 0x20))
                      (plVar17,pcVar12,local_118 & 0xffffffff,local_44,
                       *(long *)(in_RDI + 0x18) + 0x40);
    *(long *)(*(long *)(in_RDI + 0x18) + 0x48) = (long)iVar3;
  }
  if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x50) == 0) ||
     (*(ulong *)(*(long *)(in_RDI + 0x10) + 0x1b8) <= *(ulong *)(*(long *)(in_RDI + 0x18) + 0x48)))
  {
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x48) =
         *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x1b8);
    pcVar12 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x30));
    *(char **)(*(long *)(in_RDI + 0x18) + 0x40) = pcVar12;
  }
  pcVar12 = local_e8;
  pcVar14 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
  *(long *)(*(long *)(in_RDI + 0x18) + 0x18) = (long)pcVar12 - (long)pcVar14;
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20) =
       *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18);
  pcVar12 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
  *(char **)(*(long *)(in_RDI + 0x18) + 0x10) = pcVar12;
  if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x28) != 0) &&
     (plVar17 = *(long **)(*(long *)(in_RDI + 0x18) + 0x28), plVar17 != (long *)0x0)) {
    (**(code **)(*plVar17 + 8))();
  }
  Header::compression((Header *)0x1fb4ae);
  pCVar15 = newTileCompressor(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffda8,
                              (Header *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  *(Compressor **)(*(long *)(in_RDI + 0x18) + 0x28) = pCVar15;
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0x28) != 0) {
    lVar1 = *(long *)(in_RDI + 0x18);
    plVar17 = *(long **)(lVar1 + 0x28);
    uVar18 = *(undefined8 *)(lVar1 + 0x10);
    uVar19 = *(undefined4 *)(lVar1 + 0x18);
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
              ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffd54,iVar16),
               (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffd4c,iVar2));
    iVar2 = (**(code **)(*plVar17 + 0x28))
                      (plVar17,uVar18,uVar19,&stack0xfffffffffffffeb8,&local_130);
    if ((ulong)(long)iVar2 < *(ulong *)(*(long *)(in_RDI + 0x18) + 0x18)) {
      *(long *)(*(long *)(in_RDI + 0x18) + 0x18) = (long)iVar2;
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x10) = local_130;
    }
    else if (*(int *)(*(long *)(in_RDI + 0x10) + 0x118) == 0) {
      convertToXdr((Data *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88,iVar20,in_stack_fffffffffffffd78);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
	// into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //
    
        char *writePtr = _tileBuffer->buffer;
    
        Box2i tileRange = dataWindowForTile (_ofd->tileDesc,
                                                  _ofd->minX, _ofd->maxX,
                                                  _ofd->minY, _ofd->maxY,
                                                  _tileBuffer->tileCoord.dx,
                                                  _tileBuffer->tileCoord.dy,
                                                  _tileBuffer->tileCoord.lx,
                                                  _tileBuffer->tileCoord.ly);
    
        int numScanLines = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;
    
        //
        // Iterate over the scan lines in the tile.
        //
        
        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //
    
            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                const TOutSliceInfo &slice = _ofd->slices[i];
    
                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //
            
                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;
    
		//
		// Fill the tile buffer with pixel data.
		//

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //
    
                    const char *readPtr = slice.base +
                                          (y - yOffset) * slice.yStride +
                                          (tileRange.min.x - xOffset) *
                                          slice.xStride;

                    const char *endPtr  = readPtr +
                                          (numPixelsPerScanLine - 1) *
                                          slice.xStride;
                                        
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        }
        
        //
        // Compress the contents of the tileBuffer, 
        // and store the compressed data in the output file.
        //
    
        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr = _tileBuffer->buffer;
    
        if (_tileBuffer->compressor)
        {
            const char *compPtr;

            int compSize = _tileBuffer->compressor->compressTile
                                                (_tileBuffer->dataPtr,
                                                 _tileBuffer->dataSize,
                                                 tileRange, compPtr);
    
            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //
    
                convertToXdr (_ofd, _tileBuffer->buffer, numScanLines,
                              numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}